

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lexIntegerOrFloatingConstant(Lexer *this,SyntaxToken *tk)

{
  Std a;
  bool bVar1;
  int iVar2;
  ParseOptions *this_00;
  LanguageDialect *this_01;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *yytext;
  SyntaxToken *tk_local;
  Lexer *this_local;
  
  local_20 = this->yytext_ + -1;
  yytext = (char *)tk;
  tk_local = (SyntaxToken *)this;
  if ((*local_20 == '0') && (this->yychar_ != '\0')) {
    if ((this->yychar_ == 'x') || (this->yychar_ == 'X')) {
      yyinput(this);
      lexHexadecimalDigitSequence(this);
      if (this->yychar_ == '.') {
        yytext[8] = '\b';
        yytext[9] = '\0';
        yyinput(this);
        this_00 = SyntaxTree::parseOptions(this->tree_);
        this_01 = ParseOptions::languageDialect(this_00);
        a = LanguageDialect::std(this_01);
        bVar1 = operator<(a,C99);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"hexadecimal floating-point constant",&local_41);
          DiagnosticsReporter::IncompatibleLanguageDialect(&this->diagReporter_,&local_40,C99);
          std::__cxx11::string::~string((string *)&local_40);
          std::allocator<char>::~allocator(&local_41);
        }
        lexHexadecimalDigitSequence(this);
        lexBinaryExponentPart(this);
        lexFloatingOrImaginaryFloatingSuffix
                  (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
        return;
      }
      lexIntegerOrImaginaryIntegerSuffix
                (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
      return;
    }
    if ((this->yychar_ == 'b') || (this->yychar_ == 'B')) {
      yyinput(this);
      while( true ) {
        bVar1 = true;
        if (this->yychar_ != '0') {
          bVar1 = this->yychar_ == '1';
        }
        if (!bVar1) break;
        yyinput(this);
      }
      lexIntegerOrImaginaryIntegerSuffix
                (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
      return;
    }
    if ((0x2f < this->yychar_) && (this->yychar_ < 0x38)) {
      do {
        yyinput(this);
        bVar1 = false;
        if (0x2f < this->yychar_) {
          bVar1 = this->yychar_ < 0x38;
        }
      } while (bVar1);
      lexIntegerOrImaginaryIntegerSuffix
                (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
      return;
    }
  }
  while (this->yychar_ != '\0') {
    if (this->yychar_ == '.') {
      yyinput(this);
      lexFloatingOrImaginaryFloating_AtFollowOfPeriod
                (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
      return;
    }
    if ((this->yychar_ == 'e') || (this->yychar_ == 'E')) {
      lexFloatingOrImaginaryFloating_AtExponent
                (this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
      return;
    }
    iVar2 = isdigit((uint)this->yychar_);
    if (iVar2 == 0) break;
    yyinput(this);
  }
  lexIntegerOrImaginaryIntegerSuffix(this,(SyntaxToken *)yytext,(int)this->yytext_ - (int)local_20);
  return;
}

Assistant:

void Lexer::lexIntegerOrFloatingConstant(SyntaxToken* tk)
{
    const char* yytext = yytext_ - 1;

    if (*yytext == '0' && yychar_) {
        if (yychar_ == 'x'|| yychar_ == 'X') {
            yyinput();
            lexHexadecimalDigitSequence();

            if (yychar_ == '.') {
                tk->syntaxK_ = SyntaxKind::FloatingConstantToken;
                yyinput();

                if (tree_->parseOptions().languageDialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.IncompatibleLanguageDialect(
                                "hexadecimal floating-point constant",
                                LanguageDialect::Std::C99);
                }

                lexHexadecimalDigitSequence();
                lexBinaryExponentPart();
                lexFloatingOrImaginaryFloatingSuffix(tk, yytext_ - yytext);
                return;
            }
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'b' || yychar_ == 'B') {
            yyinput();
            while (yychar_ == '0' || yychar_ == '1')
                yyinput();
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ >= '0' && yychar_ <= '7') {
            do {
                yyinput();
            }
            while (yychar_ >= '0' && yychar_ <= '7');

            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }
    }

    while (yychar_) {
        if (yychar_ == '.') {
            yyinput();
            lexFloatingOrImaginaryFloating_AtFollowOfPeriod(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'e' || yychar_ == 'E') {
            lexFloatingOrImaginaryFloating_AtExponent(tk, yytext_ - yytext);
            return;
        }

        if (!std::isdigit(yychar_))
            break;
        yyinput();
    }

    lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
}